

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O0

size_t protect_count(refs_table_t *tbl)

{
  uint64_t *puVar1;
  uint64_t d;
  uint64_t *end;
  uint64_t *bucket;
  size_t count;
  refs_table_t *tbl_local;
  
  bucket = (uint64_t *)0x0;
  end = tbl->refs_table;
  puVar1 = end + tbl->refs_size;
  for (; end != puVar1; end = end + 1) {
    if ((*end != 0) && (*end != 0x7fffffffffffffff)) {
      bucket = (uint64_t *)((long)bucket + 1);
    }
  }
  return (size_t)bucket;
}

Assistant:

size_t
protect_count(refs_table_t *tbl)
{
    size_t count = 0;
    _Atomic(uint64_t)* bucket = tbl->refs_table;
    _Atomic(uint64_t)* const end = bucket + tbl->refs_size;
    while (bucket != end) {
        uint64_t d = atomic_load_explicit(bucket, memory_order_relaxed);
        if (d != 0 && d != refs_ts) count++;
        bucket++;
    }
    return count;
}